

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.h
# Opt level: O0

void __thiscall
r_exec::BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController>::
BatchReductionJob(BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController>
                  *this,SecondaryMDLController *processor,Fact *trigger,MDLController *controller)

{
  MDLController *controller_local;
  Fact *trigger_local;
  SecondaryMDLController *processor_local;
  BatchReductionJob<r_exec::SecondaryMDLController,_r_exec::Fact,_r_exec::MDLController> *this_local
  ;
  
  _ReductionJob::_ReductionJob(&this->super__ReductionJob);
  (this->super__ReductionJob).super__Object._vptr__Object =
       (_func_int **)&PTR__BatchReductionJob_002ec6e0;
  core::P<r_exec::SecondaryMDLController>::P(&this->processor,processor);
  core::P<r_exec::Fact>::P(&this->trigger,trigger);
  core::P<r_exec::MDLController>::P(&this->controller,controller);
  return;
}

Assistant:

BatchReductionJob(_P *processor, T *trigger, C *controller): _ReductionJob(), processor(processor), trigger(trigger), controller(controller) {}